

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O3

parameter * __thiscall
clipp::value<std::__cxx11::string&>
          (parameter *__return_storage_ptr__,clipp *this,doc_string *label,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tgts)

{
  match_predicate local_138;
  undefined1 local_118 [248];
  bool local_20;
  
  local_138.super__Function_base._M_functor._8_8_ = 0;
  local_138.super__Function_base._M_functor._M_unused._M_object = match::nonempty;
  local_138._M_invoker =
       std::
       _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_bool_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_138.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_bool_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  parameter::parameter((parameter *)local_118,&local_138);
  std::__cxx11::string::_M_assign((string *)(local_118 + 0xd8));
  detail::action_provider<clipp::parameter>::set<std::__cxx11::string>
            ((action_provider<clipp::parameter> *)(local_118 + 0x28),label);
  local_20 = true;
  local_118[0x20] = false;
  local_118[0x21] = true;
  parameter::parameter(__return_storage_ptr__,(parameter *)local_118);
  parameter::~parameter((parameter *)local_118);
  if (local_138.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_138.super__Function_base._M_manager)
              ((_Any_data *)&local_138,(_Any_data *)&local_138,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

inline parameter
value(const doc_string& label, Targets&&... tgts)
{
    return parameter{match::nonempty}
        .label(label)
        .target(std::forward<Targets>(tgts)...)
        .required(true).blocking(true).repeatable(false);
}